

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O1

int __thiscall MeCab::POSIDGenerator::id(POSIDGenerator *this,char *feature)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char **input;
  size_t sVar6;
  ostream *poVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  ulong size;
  char *pcVar11;
  ulong uVar12;
  char **ppcVar13;
  string tmp;
  string local_60;
  char *local_40;
  POSIDGenerator *local_38;
  
  pcVar5 = (char *)operator_new__(0x2000);
  local_40 = pcVar5;
  input = (char **)operator_new__(0x10000);
  sVar6 = strlen(feature);
  if (0x1ffe < sVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
               ,0x79);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"std::strlen(feature) < buf.size() - 1",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"too long feature",0x10);
    die::~die((die *)&local_60);
  }
  local_38 = this;
  strncpy(pcVar5,feature,0x1fff);
  sVar6 = strlen(pcVar5);
  if ((long)sVar6 < 1) {
    size = 0;
  }
  else {
    pcVar11 = pcVar5 + sVar6;
    uVar12 = 0x2000;
    size = 0;
    ppcVar13 = input;
    do {
      for (; (cVar2 = *pcVar5, cVar2 == '\t' || (cVar2 == ' ')); pcVar5 = pcVar5 + 1) {
      }
      if (cVar2 == '\"') {
        pcVar5 = pcVar5 + 1;
        pcVar9 = pcVar5;
        for (pcVar8 = pcVar5;
            (pcVar10 = pcVar8, pcVar8 < pcVar11 &&
            ((*pcVar8 != '\"' ||
             (pcVar10 = pcVar8 + 1, pcVar1 = pcVar8 + 1, pcVar8 = pcVar10, *pcVar1 == '\"'))));
            pcVar8 = pcVar8 + 1) {
          *pcVar9 = *pcVar8;
          pcVar9 = pcVar9 + 1;
        }
        local_60._M_dataplus._M_p._0_1_ = 0x2c;
        pcVar8 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (pcVar10,pcVar11,&local_60);
      }
      else {
        local_60._M_dataplus._M_p._0_1_ = 0x2c;
        pcVar8 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (pcVar5,pcVar11,&local_60);
        pcVar9 = pcVar8;
      }
      if (1 < uVar12) {
        *pcVar9 = '\0';
      }
      uVar12 = uVar12 - 1;
      *ppcVar13 = pcVar5;
      size = size + 1;
      if (uVar12 == 0) break;
      ppcVar13 = ppcVar13 + 1;
      pcVar5 = pcVar8 + 1;
    } while (pcVar5 < pcVar11);
  }
  pcVar5 = local_40;
  if (0x1fff < size) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
               ,0x79);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xeb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"n < col.size()",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"too long CSV entities",0x15);
    die::~die((die *)&local_60);
  }
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  bVar3 = RewriteRules::rewrite(&local_38->rewrite_,size,input,&local_60);
  iVar4 = -1;
  if (bVar3) {
    iVar4 = atoi(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  operator_delete__(input);
  operator_delete__(pcVar5);
  return iVar4;
}

Assistant:

int POSIDGenerator::id(const char *feature) const {
  scoped_fixed_array<char, BUF_SIZE> buf;
  scoped_fixed_array<char *, BUF_SIZE> col;
  CHECK_DIE(std::strlen(feature) < buf.size() - 1) << "too long feature";
  std::strncpy(buf.get(), feature, buf.size() - 1);
  const size_t n = tokenizeCSV(buf.get(), col.get(), col.size());
  CHECK_DIE(n < col.size()) << "too long CSV entities";
  std::string tmp;
  if (!rewrite_.rewrite(n, const_cast<const char **>(col.get()), &tmp)) {
    return -1;
  }
  return std::atoi(tmp.c_str());
}